

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_range_iterator.cc
# Opt level: O3

void __thiscall s2shapeutil::RangeIterator::SeekTo(RangeIterator *this,RangeIterator *target)

{
  _Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  _Var1;
  ulong uVar2;
  S2CellId SVar3;
  char cVar4;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var5;
  
  _Var1.super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl =
       (this->it_).iter_._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>;
  (**(code **)(*(long *)_Var1.super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                        _M_head_impl + 0x30))
            (_Var1.super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl,
             (target->range_min_).id_);
  _Var5._M_head_impl =
       (this->it_).iter_._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  uVar2 = *(ulong *)((long)_Var5._M_head_impl + 8);
  if ((uVar2 == 0xffffffffffffffff) || ((target->range_max_).id_ < uVar2 - (~uVar2 & uVar2 - 1))) {
    cVar4 = (**(code **)(*(long *)_Var5._M_head_impl + 0x28))();
    _Var5._M_head_impl =
         (this->it_).iter_._M_t.
         super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
    if ((cVar4 != '\0') &&
       (uVar2 = ((S2CellId *)((long)_Var5._M_head_impl + 8))->id_,
       (uVar2 - 1 | uVar2) <
       *(ulong *)((long)(target->it_).iter_._M_t.
                        super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                        .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> + 8))) {
      (*(_Var5._M_head_impl)->_vptr_IteratorBase[4])();
      _Var5._M_head_impl =
           (this->it_).iter_._M_t.
           super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
           .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
    }
  }
  SVar3.id_ = ((_Var5._M_head_impl)->id_).id_;
  (this->range_min_).id_ = SVar3.id_ - (~SVar3.id_ & SVar3.id_ - 1);
  SVar3.id_ = ((_Var5._M_head_impl)->id_).id_;
  (this->range_max_).id_ = SVar3.id_ - 1 | SVar3.id_;
  return;
}

Assistant:

void RangeIterator::SeekTo(const RangeIterator& target) {
  it_.Seek(target.range_min());
  // If the current cell does not overlap "target", it is possible that the
  // previous cell is the one we are looking for.  This can only happen when
  // the previous cell contains "target" but has a smaller S2CellId.
  if (it_.done() || it_.id().range_min() > target.range_max()) {
    if (it_.Prev() && it_.id().range_max() < target.id()) it_.Next();
  }
  Refresh();
}